

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O2

bool Rml::ElementUtilities::GetBoundingBox
               (Rectanglef *out_rectangle,Element *element,BoxArea box_area)

{
  long lVar1;
  code *pcVar2;
  Vector2Type VVar3;
  bool bVar4;
  Property *pPVar5;
  Box *this;
  TransformState *this_00;
  Matrix4f *rhs;
  Context *this_01;
  Vector2i VVar6;
  byte bVar7;
  BoxShadow *shadow;
  long lVar8;
  int i_1;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector2Type top_left;
  Vector2f VVar12;
  Vector2f VVar13;
  Vector2f VVar14;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  VectorType VVar17;
  Rectangle<float> RVar18;
  float local_128;
  float fStack_124;
  Vector2Type local_108;
  Rectangle<float> local_e8;
  Vector2f corners [4];
  Vector2f local_b8;
  undefined8 uStack_b0;
  Matrix4f project_transform;
  Matrix4f project;
  
  if ((element == (Element *)0x0) &&
     (bVar4 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                     ,0x104), !bVar4)) {
LAB_00299503:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  top_left.x = 0.0;
  top_left.y = 0.0;
  local_108.x = 0.0;
  local_108.y = 0.0;
  if (box_area == Auto) {
    pPVar5 = Element::GetLocalProperty(element,BoxShadow);
    box_area = Border;
    if (pPVar5 == (Property *)0x0) {
      top_left.x = 0.0;
      top_left.y = 0.0;
    }
    else {
      if (((pPVar5->value).type != BOXSHADOWLIST) &&
         (bVar4 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                         ,0x10f), !bVar4)) goto LAB_00299503;
      lVar8 = *(long *)(pPVar5->value).data;
      lVar1 = *(long *)((pPVar5->value).data + 8);
      top_left.x = 0.0;
      top_left.y = 0.0;
      local_108.x = 0.0;
      local_108.y = 0.0;
      for (; lVar8 != lVar1; lVar8 = lVar8 + 0x28) {
        if (*(char *)(lVar8 + 0x24) == '\0') {
          fVar9 = Element::ResolveLength(element,*(NumericValue *)(lVar8 + 0x14));
          fVar10 = Element::ResolveLength(element,*(NumericValue *)(lVar8 + 0x1c));
          fVar10 = fVar9 * 1.5 + fVar10;
          fVar9 = Element::ResolveLength(element,*(NumericValue *)(lVar8 + 4));
          fVar11 = Element::ResolveLength(element,*(NumericValue *)(lVar8 + 0xc));
          VVar12.y = fVar10 - fVar11;
          VVar12.x = fVar10 - fVar9;
          top_left = Math::Max<Rml::Vector2<float>>(top_left,VVar12);
          VVar13.y = fVar11 + fVar10;
          VVar13.x = fVar9 + fVar10;
          local_108 = Math::Max<Rml::Vector2<float>>(local_108,VVar13);
        }
      }
    }
  }
  VVar12 = Element::GetAbsoluteOffset(element,box_area);
  this = Element::GetBox(element);
  VVar13 = Box::GetSize(this,box_area);
  local_128 = VVar12.x;
  fStack_124 = VVar12.y;
  local_e8.p1.x = VVar13.x + local_128;
  local_e8.p0.x = VVar12.x;
  local_e8.p0.y = VVar12.y;
  local_e8.p1.y = VVar13.y + fStack_124;
  local_e8 = Rectangle<float>::Extend(&local_e8,top_left,local_108);
  this_00 = Element::GetTransformState(element);
  if ((this_00 != (TransformState *)0x0) &&
     (rhs = TransformState::GetTransform(this_00), rhs != (Matrix4f *)0x0)) {
    this_01 = Element::GetContext(element);
    if (this_01 != (Context *)0x0) {
      corners[1].x = local_e8.p1.x;
      corners[0].x = local_e8.p0.x;
      corners[0].y = local_e8.p0.y;
      corners[3].x = local_e8.p0.x;
      corners[2].x = local_e8.p1.x;
      corners[2].y = local_e8.p1.y;
      corners[3].y = local_e8.p1.y;
      corners[1].y = local_e8.p0.y;
      VVar6 = Context::GetDimensions(this_01);
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::ProjectOrtho
                (&project,0.0,(float)VVar6.x,0.0,(float)VVar6.y,-10000.0,10000.0);
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
      MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
      Multiply(&project_transform,&project,rhs);
      bVar7 = 0;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        local_b8 = corners[lVar8];
        uStack_b0._0_4_ = 0.0;
        uStack_b0._4_4_ = 1.0;
        VVar17 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
                 VectorMultiplier<float,_Rml::ColumnMajorStorage<float>_>::Multiply
                           (&project_transform,(VectorType *)&local_b8);
        fVar9 = VVar17.w;
        auVar15._0_8_ = VVar17._0_8_;
        auVar15._8_8_ = extraout_XMM0_Qb;
        auVar16._4_4_ = fVar9;
        auVar16._0_4_ = fVar9;
        auVar16._8_4_ = fVar9;
        auVar16._12_4_ = fVar9;
        auVar15 = divps(auVar15,auVar16);
        VVar14.x = (auVar15._0_4_ + 1.0) * (float)VVar6.x * 0.5;
        VVar14.y = (auVar15._4_4_ + 1.0) * (float)VVar6.y * 0.5;
        corners[lVar8] = VVar14;
        bVar7 = bVar7 | (VVar17.z < -fVar9 || fVar9 < VVar17.z);
      }
      if (bVar7 == 0) {
        VVar3.y = corners[0].y;
        VVar3.x = corners[0].x;
        out_rectangle->p0 = VVar3;
        out_rectangle->p1 = VVar3;
        for (lVar8 = 1; lVar8 != 4; lVar8 = lVar8 + 1) {
          RVar18 = Rectangle<float>::Join(out_rectangle,corners[lVar8]);
          out_rectangle->p0 = RVar18.p0;
          out_rectangle->p1 = RVar18.p1;
        }
      }
      return (bool)(bVar7 ^ 1);
    }
    return false;
  }
  out_rectangle->p0 = local_e8.p0;
  out_rectangle->p1 = local_e8.p1;
  return true;
}

Assistant:

bool ElementUtilities::GetBoundingBox(Rectanglef& out_rectangle, Element* element, BoxArea box_area)
{
	RMLUI_ASSERT(element);

	Vector2f shadow_extent_top_left, shadow_extent_bottom_right;
	if (box_area == BoxArea::Auto)
	{
		// 'Auto' acts like border box extended to encompass any ink overflow, including the element's box-shadow.
		// Note: Does not currently include ink overflow due to filters, as that is handled manually in ElementEffects.
		box_area = BoxArea::Border;

		if (const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow))
		{
			RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
			const BoxShadowList& shadow_list = p_box_shadow->value.GetReference<BoxShadowList>();

			for (const BoxShadow& shadow : shadow_list)
			{
				if (!shadow.inset)
				{
					const float extent = 1.5f * element->ResolveLength(shadow.blur_radius) + element->ResolveLength(shadow.spread_distance);
					const Vector2f offset = {element->ResolveLength(shadow.offset_x), element->ResolveLength(shadow.offset_y)};

					shadow_extent_top_left = Math::Max(shadow_extent_top_left, -offset + Vector2f(extent));
					shadow_extent_bottom_right = Math::Max(shadow_extent_bottom_right, offset + Vector2f(extent));
				}
			}
		}
	}

	// Element bounds in non-transformed space.
	Rectanglef bounds = Rectanglef::FromPositionSize(element->GetAbsoluteOffset(box_area), element->GetBox().GetSize(box_area));
	bounds = bounds.Extend(shadow_extent_top_left, shadow_extent_bottom_right);

	const TransformState* transform_state = element->GetTransformState();
	const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);

	// Early exit in the common case of no transform.
	if (!transform)
	{
		out_rectangle = bounds;
		return true;
	}

	Context* context = element->GetContext();
	if (!context)
		return false;

	constexpr int num_corners = 4;
	Vector2f corners[num_corners] = {
		bounds.TopLeft(),
		bounds.TopRight(),
		bounds.BottomRight(),
		bounds.BottomLeft(),
	};

	// Transform and project corners to window coordinates.
	constexpr float z_clip = 10'000.f;
	const Vector2f window_size = Vector2f(context->GetDimensions());
	const Matrix4f project = Matrix4f::ProjectOrtho(0.f, window_size.x, 0.f, window_size.y, -z_clip, z_clip);
	const Matrix4f project_transform = project * (*transform);
	bool any_vertex_depth_clipped = false;

	for (int i = 0; i < num_corners; i++)
	{
		const Vector4f pos_clip_space = project_transform * Vector4f(corners[i].x, corners[i].y, 0, 1);
		const Vector2f pos_ndc = Vector2f(pos_clip_space.x, pos_clip_space.y) / pos_clip_space.w;
		const Vector2f pos_viewport = 0.5f * window_size * (pos_ndc + Vector2f(1));
		corners[i] = pos_viewport;
		any_vertex_depth_clipped |= !(-pos_clip_space.w <= pos_clip_space.z && pos_clip_space.z <= pos_clip_space.w);
	}

	// If any part of the box area is outside the depth clip planes we give up finding the bounding box. In this situation a renderer would normally
	// clip the underlying triangles against the clip planes. We could in principle do the same, but the added complexity does not seem worthwhile for
	// our use cases.
	if (any_vertex_depth_clipped)
		return false;

	// Find the rectangle covering the projected corners.
	out_rectangle = Rectanglef::FromPosition(corners[0]);
	for (int i = 1; i < num_corners; i++)
		out_rectangle = out_rectangle.Join(corners[i]);

	return true;
}